

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_zhao_2010.h
# Opt level: O3

void __thiscall SBLA::SecondScan(SBLA *this)

{
  uint *puVar1;
  char cVar2;
  long lVar3;
  Mat1i *pMVar4;
  char *pcVar5;
  long lVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  
  iVar9 = this->M;
  iVar7 = this->N;
  if (0 < iVar7 * iVar9) {
    lVar3 = *(long *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->field_0x10;
    lVar6 = 0;
    do {
      uVar10 = *(uint *)(lVar3 + lVar6 * 4);
      if ((int)uVar10 < 0) {
        do {
          uVar8 = -uVar10;
          uVar11 = *(uint *)(lVar3 + (ulong)uVar8 * 4);
          if (uVar10 == uVar11) break;
          uVar10 = uVar11;
        } while ((int)uVar11 < 0);
        if ((int)uVar11 < 0) {
          uVar11 = (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ + 1;
          (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar11;
          *(uint *)(lVar3 + (ulong)uVar8 * 4) = uVar11;
        }
        *(uint *)(lVar3 + lVar6 * 4) = uVar11;
        iVar7 = this->N;
        iVar9 = this->M;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < iVar7 * iVar9);
  }
  cVar2 = (this->super_Labeling2D<(Connectivity2D)8,_false>).field_0x74;
  if (cVar2 == '\0') goto LAB_001e136a;
  **(char **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x10 = cVar2;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  if (1 < this->N) {
    pcVar5 = *(char **)&pMVar4->field_0x10;
    cVar2 = pcVar5[1];
    if (cVar2 != '\0') {
      *pcVar5 = cVar2;
      goto LAB_001e136a;
    }
  }
  pcVar5 = *(char **)&pMVar4->field_0x10;
  if (1 < this->M) {
    lVar3 = **(long **)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x48;
    if (pcVar5[lVar3] != '\0') {
      *pcVar5 = pcVar5[lVar3];
      goto LAB_001e136a;
    }
    if ((1 < this->N) && (pcVar5[lVar3 + 1] != '\0')) {
      *pcVar5 = pcVar5[lVar3 + 1];
      goto LAB_001e136a;
    }
  }
  *pcVar5 = '\x01';
LAB_001e136a:
  puVar1 = &(this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_;
  *puVar1 = *puVar1 + 1;
  return;
}

Assistant:

void SecondScan()
    {
        // Label assignment
        int *img_labelsdata = reinterpret_cast<int*>(img_labels_.data);
        for (int i = 0; i < M * N; ++i) {
            // FindRoot_GetLabel
            int pos = img_labelsdata[i];
            if (pos >= 0)
                continue;

            int tmp;
            while (true) {
                tmp = img_labelsdata[-pos];
                if (pos == tmp || tmp >= 0)
                    break;
                pos = tmp;
            }
            if (tmp < 0)
                img_labelsdata[-pos] = ++n_labels_;

            // Assign final label
            img_labelsdata[i] = img_labelsdata[-pos];
        }

        // Fix for first pixel!
        if (firstpixel) {
            const_cast<cv::Mat1b&>(img_).data[0] = firstpixel;
            if (N > 1 && img_labels_.data[1])
                img_labels_.data[0] = img_labels_.data[1];
            else if (M > 1 && img_labels_.data[img_.step[0]])
                img_labels_.data[0] = img_labels_.data[img_.step[0]];
            else if (N > 1 && M > 1 && img_labels_.data[img_.step[0] + 1])
                img_labels_.data[0] = img_labels_.data[img_.step[0] + 1];
            else
                img_labels_.data[0] = 1;
        }

        n_labels_++; // To count also background
    }